

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O2

void rec_new(char *identifer,Object value,Environment *parent)

{
  Record *pRVar1;
  Record **ppRVar2;
  
  pRVar1 = (Record *)malloc(0x50);
  pRVar1->name = identifer;
  if (value.type == OBJECT_INSTANCE) {
    if ((value.field_1.instance)->fromReturn == 1) {
      (value.field_1.instance)->fromReturn = 0;
    }
    (value.field_1.instance)->refCount = (value.field_1.instance)->refCount + 1;
  }
  *(Statement **)((long)&(pRVar1->object).field_1 + 0x28) =
       value.field_1.container.constructor.statements;
  *(Statement **)((long)&(pRVar1->object).field_1 + 0x30) = value.field_1.routine.code.statements;
  (pRVar1->object).field_1.routine.arguments = value.field_1.routine.arguments;
  *(undefined8 *)((long)&(pRVar1->object).field_1 + 0x20) = value.field_1._32_8_;
  (pRVar1->object).field_1.literal.field_2 = value.field_1.literal.field_2;
  *(undefined8 *)((long)&(pRVar1->object).field_1 + 0x10) = value.field_1._16_8_;
  *(long *)&pRVar1->object = value._0_8_;
  (pRVar1->object).field_1.instance = value.field_1.instance;
  pRVar1->next = (Record *)0x0;
  ppRVar2 = &parent->rear;
  if (parent->front != (Record *)0x0) {
    parent = (Environment *)ppRVar2;
    ppRVar2 = &(*ppRVar2)->next;
  }
  *ppRVar2 = pRVar1;
  parent->front = pRVar1;
  return;
}

Assistant:

static void rec_new(char* identifer, Object value, Environment *parent){
    Record *env = (Record *)mallocate(sizeof(Record));
    env->name = identifer;
    incr_ref(value);
    env->object = value;
    env->next = NULL;
    insert(env, parent);
}